

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoding.hpp
# Opt level: O2

size_t __thiscall Centaurus::Encoder::wcstombs(Encoder *this,char *__s,wchar_t *__pwcs,size_t __n)

{
  undefined8 uVar1;
  char cVar2;
  char *to_next;
  wchar_t *from_next;
  mbstate_t mb;
  
  mb.__count = 0;
  mb.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  uVar1 = *(undefined8 *)(__pwcs + 2);
  cVar2 = (**(code **)(**(long **)__s + 0x40))();
  this->m_forward_cvt = (codecvt<wchar_t,_char,___mbstate_t> *)(this + 2);
  std::__cxx11::string::_M_construct((ulong)this,cVar2 * (char)uVar1);
  (**(code **)(**(long **)__s + 0x10))
            (*(long **)__s,&mb,*(long *)__pwcs,*(long *)__pwcs + *(long *)(__pwcs + 2) * 4,
             &from_next,this->m_forward_cvt,this[1].m_forward_cvt + (long)this->m_forward_cvt,
             &to_next);
  std::__cxx11::string::resize((ulong)this);
  return (size_t)this;
}

Assistant:

std::string wcstombs(const std::wstring& internal)
    {
        std::mbstate_t mb{};
        std::string external(internal.size() * m_forward_cvt.max_length(), '\0');

        const wchar_t *from_next;
        char *to_next;

        m_forward_cvt.out(mb, &internal[0], &internal[internal.size()], from_next, &external[0], &external[external.size()], to_next);

        external.resize(to_next - &external[0]);

        return external;
    }